

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::AddRequiredTargetCFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  pointer pcVar1;
  cmake *this_00;
  bool bVar2;
  char *__s;
  string *psVar3;
  char **ppcVar4;
  ostream *poVar5;
  size_t sVar6;
  byte bVar7;
  char *pcVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool needC11;
  bool needC99;
  bool needC90;
  ostringstream e;
  bool local_27b;
  bool local_27a;
  bool local_279;
  char **local_278;
  cmTarget *local_270;
  string local_268;
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_279 = false;
  local_27a = false;
  local_27b = false;
  CheckNeededCLanguage(this,feature,&local_279,&local_27a,&local_27b);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
  local_270 = target;
  __s = cmTarget::GetProperty(target,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (__s == (char *)0x0) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_C_STANDARD_DEFAULT","");
    psVar3 = GetDef(this,(string *)local_1a8);
    if (psVar3 == (string *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = (psVar3->_M_dataplus)._M_p;
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    __s = (char *)0x0;
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      __s = pcVar8;
    }
  }
  if (__s == (char *)0x0) {
    local_278 = (char **)&DAT_007172d8;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,__s,(allocator<char> *)local_1a8);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_007172d8,(cmStrCmp *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (ppcVar4 == (char **)&DAT_007172d8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The C_STANDARD property on target \"",0x23);
      psVar3 = cmTarget::GetName_abi_cxx11_(local_270);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\" contained an invalid value: \"",0x1f);
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
      if (error == (string *)0x0) {
        this_00 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_268,&this->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_268);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,__s,(allocator<char> *)local_1a8);
    local_278 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_007172d8,(cmStrCmp *)local_1e8);
  }
  if ((__s != (char *)0x0) && (local_1e8[0] != local_1d8)) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  bVar2 = local_279;
  bVar13 = local_27a;
  bVar14 = local_27b;
  bVar15 = __s == (char *)0x0;
  bVar7 = !bVar15 & local_27b;
  if (bVar7 == 1) {
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"11","");
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_007172d8,(cmStrCmp *)local_208);
    bVar12 = local_278 < ppcVar4;
  }
  else {
    bVar12 = false;
  }
  if ((bVar7 != 0) && (local_208[0] != local_1f8)) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  bVar10 = bVar15 & bVar2;
  bVar7 = bVar15 & bVar13;
  if (bVar12) {
    bVar9 = 1;
  }
  else {
    bVar9 = __s != (char *)0x0 & bVar13;
    if (bVar9 == 1) {
      local_248[0] = local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"99","");
      ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_007172d8,(cmStrCmp *)local_248);
      bVar13 = local_278 < ppcVar4;
    }
    else {
      bVar13 = false;
    }
    if ((bVar9 != 0) && (local_248[0] != local_238)) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
    bVar9 = bVar15 & bVar14;
    if (bVar13) {
      bVar7 = 1;
    }
    else {
      bVar11 = __s != (char *)0x0 & bVar2;
      if (bVar11 == 1) {
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"90","");
        ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_007172d8,(cmStrCmp *)local_228);
        bVar14 = local_278 < ppcVar4;
      }
      else {
        bVar14 = false;
      }
      if ((bVar11 != 0) && (local_228[0] != local_218)) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
      bVar10 = bVar10 | bVar14;
    }
  }
  if (bVar9 == 0) {
    if (bVar7 == 0) {
      if (bVar10 == 0) {
        return true;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
      cmTarget::SetProperty(local_270,(string *)local_1a8,"90");
      if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
        return true;
      }
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      return true;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"99");
  }
  else {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"11");
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmMakefile::AddRequiredTargetCFeature(cmTarget* target,
                                           const std::string& feature,
                                           std::string* error) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char* existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard == nullptr) {
    const char* defaultCStandard =
      this->GetDefinition("CMAKE_C_STANDARD_DEFAULT");
    if (defaultCStandard && *defaultCStandard) {
      existingCStandard = defaultCStandard;
    }
  }
  if (existingCStandard) {
    if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                     cmStrCmp(existingCStandard)) == cm::cend(C_STANDARDS)) {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCIt = existingCStandard
    ? std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard))
    : cm::cend(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("11"))) {
    setC11 = true;
  } else if (needC99 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("99"))) {
    setC99 = true;
  } else if (needC90 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("90"))) {
    setC90 = true;
  }

  if (setC11) {
    target->SetProperty("C_STANDARD", "11");
  } else if (setC99) {
    target->SetProperty("C_STANDARD", "99");
  } else if (setC90) {
    target->SetProperty("C_STANDARD", "90");
  }
  return true;
}